

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O3

void alSourceRewindv(ALsizei n,ALuint *names)

{
  ulong uVar1;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSourceRewindv);
  IO_UINT64((long)n);
  IO_UINT64((uint64)names);
  if (n < 1) {
    (*REAL_alSourceRewindv)(n,names);
  }
  else {
    uVar1 = 0;
    do {
      writele32(names[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
    (*REAL_alSourceRewindv)(n,names);
    if (0 < n) {
      uVar1 = 0;
      do {
        check_source_state_from_name(names[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)n != uVar1);
    }
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSourceRewindv(ALsizei n, const ALuint *names)
{
    ALsizei i;

    IO_START(alSourceRewindv);
    IO_ALSIZEI(n);
    IO_PTR(names);
    for (i = 0; i < n; i++) {
        IO_UINT32(names[i]);
    }

    REAL_alSourceRewindv(n, names);

    for (i = 0; i < n; i++) {
        check_source_state_from_name(names[i]);
    }

    IO_END();
}